

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-mip-test.h
# Opt level: O3

void __thiscall mip_converter_test::MIPInstance::SparseVec::~SparseVec(SparseVec *this)

{
  pointer piVar1;
  pointer pdVar2;
  
  piVar1 = (this->v_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->v_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  pdVar2 = (this->c_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->c_).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
    return;
  }
  return;
}

Assistant:

SparseVec(const std::vector<double>& c, const std::vector<int>& v) :
      c_(c), v_(v) { }